

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse2::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  Scene *pSVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  RayQueryContext *pRVar8;
  uint uVar9;
  ulong uVar10;
  RayQueryContext *pRVar11;
  Scene *pSVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  float fVar24;
  float fVar35;
  float fVar36;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar75;
  float fVar76;
  float fVar78;
  undefined1 auVar73 [16];
  float fVar77;
  float fVar79;
  undefined1 auVar74 [16];
  float fVar80;
  float fVar81;
  float fVar84;
  float fVar85;
  float fVar87;
  undefined1 auVar82 [16];
  float fVar86;
  float fVar88;
  undefined1 auVar83 [16];
  uint uVar89;
  float fVar90;
  uint uVar91;
  float fVar92;
  uint uVar93;
  float fVar94;
  uint uVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  Intersectors *local_1048;
  size_t local_1040;
  Precalculations *local_1038;
  RayHitK<4> *local_1030;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [3912];
  
  local_1038 = pre;
  local_1048 = This;
  pRVar11 = (RayQueryContext *)(local_f78 + 0x10);
  local_f78._0_8_ = root.ptr;
  local_f78._8_4_ = 0;
  fVar24 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar35 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar36 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_f88 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fStack_f84 = local_f88;
  fStack_f80 = local_f88;
  fStack_f7c = local_f88;
  local_f98 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  local_fa8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fVar69 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar72 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar61 = fVar69 * 0.99999964;
  fVar65 = fVar72 * 0.99999964;
  fVar96 = fVar80 * 0.99999964;
  fVar69 = fVar69 * 1.0000004;
  fVar72 = fVar72 * 1.0000004;
  fVar80 = fVar80 * 1.0000004;
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar10 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar20 = (tray->tnear).field_0.i[k];
  auVar32._4_4_ = iVar20;
  auVar32._0_4_ = iVar20;
  auVar32._8_4_ = iVar20;
  auVar32._12_4_ = iVar20;
  iVar20 = (tray->tfar).field_0.i[k];
  local_1030 = ray;
  local_1040 = k;
  local_fc8 = fVar24;
  fStack_fc4 = fVar24;
  fStack_fc0 = fVar24;
  fStack_fbc = fVar24;
  local_fd8 = fVar35;
  fStack_fd4 = fVar35;
  fStack_fd0 = fVar35;
  fStack_fcc = fVar35;
  local_fe8 = fVar36;
  fStack_fe4 = fVar36;
  fStack_fe0 = fVar36;
  fStack_fdc = fVar36;
  local_ff8 = fVar69;
  fStack_ff4 = fVar69;
  fStack_ff0 = fVar69;
  fStack_fec = fVar69;
  local_1008 = fVar72;
  fStack_1004 = fVar72;
  fStack_1000 = fVar72;
  fStack_ffc = fVar72;
  local_1018 = fVar80;
  fStack_1014 = fVar80;
  fStack_1010 = fVar80;
  fStack_100c = fVar80;
  local_1028 = fVar96;
  fStack_1024 = fVar96;
  fStack_1020 = fVar96;
  fStack_101c = fVar96;
  local_1058 = fVar61;
  fStack_1054 = fVar61;
  fStack_1050 = fVar61;
  fStack_104c = fVar61;
  local_1068 = fVar65;
  fStack_1064 = fVar65;
  fStack_1060 = fVar65;
  fStack_105c = fVar65;
  local_1078 = auVar32;
  sVar15 = k;
  iVar21 = iVar20;
  iVar22 = iVar20;
  iVar23 = iVar20;
  fVar70 = fVar24;
  fVar71 = fVar24;
  fVar97 = fVar24;
  fVar98 = fVar69;
  fVar99 = fVar69;
  fVar100 = fVar69;
  fVar77 = fVar36;
  fVar79 = fVar36;
  fVar81 = fVar36;
  fVar86 = fVar96;
  fVar88 = fVar96;
  fVar101 = fVar96;
  fVar90 = fVar35;
  fVar92 = fVar35;
  fVar94 = fVar35;
  fVar62 = fVar61;
  fVar63 = fVar61;
  fVar64 = fVar61;
  fVar66 = fVar65;
  fVar67 = fVar65;
  fVar68 = fVar65;
  fVar75 = fVar72;
  fVar76 = fVar72;
  fVar78 = fVar72;
  fVar84 = fVar80;
  fVar85 = fVar80;
  fVar87 = fVar80;
  while (pRVar8 = pRVar11 + -1, pRVar11 = (RayQueryContext *)&pRVar11[-1].user,
        *(float *)(ray + sVar15 * 4 + 0x80) <= *(float *)&pRVar8->args &&
        *(float *)&pRVar8->args != *(float *)(ray + sVar15 * 4 + 0x80)) {
LAB_001fd065:
    if (pRVar11 == (RayQueryContext *)local_f78) {
      return;
    }
  }
  pSVar12 = *(Scene **)pRVar11;
LAB_001fc9fa:
  if (((ulong)pSVar12 & 0xf) == 0) {
    pfVar1 = (float *)((long)&(pSVar12->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + uVar14);
    auVar25._0_4_ = (*pfVar1 - fVar24) * fVar61;
    auVar25._4_4_ = (pfVar1[1] - fVar70) * fVar62;
    auVar25._8_4_ = (pfVar1[2] - fVar71) * fVar63;
    auVar25._12_4_ = (pfVar1[3] - fVar97) * fVar64;
    pfVar1 = (float *)((long)&(pSVar12->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + uVar16);
    auVar37._0_4_ = (*pfVar1 - fVar35) * fVar65;
    auVar37._4_4_ = (pfVar1[1] - fVar90) * fVar66;
    auVar37._8_4_ = (pfVar1[2] - fVar92) * fVar67;
    auVar37._12_4_ = (pfVar1[3] - fVar94) * fVar68;
    auVar26 = maxps(auVar25,auVar37);
    pfVar1 = (float *)((long)&(pSVar12->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + uVar10);
    auVar38._0_4_ = (*pfVar1 - fVar36) * fVar96;
    auVar38._4_4_ = (pfVar1[1] - fVar77) * fVar86;
    auVar38._8_4_ = (pfVar1[2] - fVar79) * fVar88;
    auVar38._12_4_ = (pfVar1[3] - fVar81) * fVar101;
    pfVar1 = (float *)((long)&(pSVar12->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + (uVar14 ^ 0x10));
    auVar43._0_4_ = (*pfVar1 - fVar24) * fVar69;
    auVar43._4_4_ = (pfVar1[1] - fVar70) * fVar98;
    auVar43._8_4_ = (pfVar1[2] - fVar71) * fVar99;
    auVar43._12_4_ = (pfVar1[3] - fVar97) * fVar100;
    pfVar1 = (float *)((long)&(pSVar12->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + (uVar16 ^ 0x10));
    auVar49._0_4_ = (*pfVar1 - fVar35) * fVar72;
    auVar49._4_4_ = (pfVar1[1] - fVar90) * fVar75;
    auVar49._8_4_ = (pfVar1[2] - fVar92) * fVar76;
    auVar49._12_4_ = (pfVar1[3] - fVar94) * fVar78;
    auVar44 = minps(auVar43,auVar49);
    pfVar1 = (float *)((long)&(pSVar12->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.
                              upper.field_0 + (uVar10 ^ 0x10));
    auVar50._0_4_ = (*pfVar1 - fVar36) * fVar80;
    auVar50._4_4_ = (pfVar1[1] - fVar77) * fVar84;
    auVar50._8_4_ = (pfVar1[2] - fVar79) * fVar85;
    auVar50._12_4_ = (pfVar1[3] - fVar81) * fVar87;
    auVar39 = maxps(auVar38,auVar32);
    _local_1088 = maxps(auVar26,auVar39);
    auVar7._4_4_ = iVar21;
    auVar7._0_4_ = iVar20;
    auVar7._8_4_ = iVar22;
    auVar7._12_4_ = iVar23;
    auVar26 = minps(auVar50,auVar7);
    auVar26 = minps(auVar44,auVar26);
    auVar27._4_4_ = -(uint)(local_1088._4_4_ <= auVar26._4_4_);
    auVar27._0_4_ = -(uint)(local_1088._0_4_ <= auVar26._0_4_);
    auVar27._8_4_ = -(uint)(local_1088._8_4_ <= auVar26._8_4_);
    auVar27._12_4_ = -(uint)(local_1088._12_4_ <= auVar26._12_4_);
    uVar9 = movmskps((int)k,auVar27);
  }
  else {
    if ((int)((ulong)pSVar12 & 0xf) != 2) {
      k = (size_t)context;
      (**(code **)((long)local_1048->leafIntersector +
                  (ulong)*(byte *)((ulong)pSVar12 & 0xfffffffffffffff0) * 0x40 + 0x10))
                (local_1038,ray,sVar15);
      iVar20 = *(int *)(local_1030 + local_1040 * 4 + 0x80);
      ray = local_1030;
      sVar15 = local_1040;
      iVar21 = iVar20;
      iVar22 = iVar20;
      iVar23 = iVar20;
      auVar32 = local_1078;
      fVar24 = local_fc8;
      fVar70 = fStack_fc4;
      fVar71 = fStack_fc0;
      fVar97 = fStack_fbc;
      fVar69 = local_ff8;
      fVar98 = fStack_ff4;
      fVar99 = fStack_ff0;
      fVar100 = fStack_fec;
      fVar36 = local_fe8;
      fVar77 = fStack_fe4;
      fVar79 = fStack_fe0;
      fVar81 = fStack_fdc;
      fVar96 = local_1028;
      fVar86 = fStack_1024;
      fVar88 = fStack_1020;
      fVar101 = fStack_101c;
      fVar35 = local_fd8;
      fVar90 = fStack_fd4;
      fVar92 = fStack_fd0;
      fVar94 = fStack_fcc;
      fVar61 = local_1058;
      fVar62 = fStack_1054;
      fVar63 = fStack_1050;
      fVar64 = fStack_104c;
      fVar65 = local_1068;
      fVar66 = fStack_1064;
      fVar67 = fStack_1060;
      fVar68 = fStack_105c;
      fVar72 = local_1008;
      fVar75 = fStack_1004;
      fVar76 = fStack_1000;
      fVar78 = fStack_ffc;
      fVar80 = local_1018;
      fVar84 = fStack_1014;
      fVar85 = fStack_1010;
      fVar87 = fStack_100c;
      goto LAB_001fd065;
    }
    uVar13 = (ulong)pSVar12 & 0xfffffffffffffff0;
    local_fb8 = *(float *)(uVar13 + 0x70);
    fStack_fb4 = *(float *)(uVar13 + 0x74);
    fStack_fb0 = *(float *)(uVar13 + 0x78);
    fStack_fac = *(float *)(uVar13 + 0x7c);
    fVar97 = local_f88 * *(float *)(uVar13 + 0x20) +
             local_f98 * *(float *)(uVar13 + 0x50) + local_fa8 * *(float *)(uVar13 + 0x80);
    fVar98 = fStack_f84 * *(float *)(uVar13 + 0x24) +
             fStack_f94 * *(float *)(uVar13 + 0x54) + fStack_fa4 * *(float *)(uVar13 + 0x84);
    fVar99 = fStack_f80 * *(float *)(uVar13 + 0x28) +
             fStack_f90 * *(float *)(uVar13 + 0x58) + fStack_fa0 * *(float *)(uVar13 + 0x88);
    fVar100 = fStack_f7c * *(float *)(uVar13 + 0x2c) +
              fStack_f8c * *(float *)(uVar13 + 0x5c) + fStack_f9c * *(float *)(uVar13 + 0x8c);
    fVar24 = local_f88 * *(float *)(uVar13 + 0x30) +
             local_f98 * *(float *)(uVar13 + 0x60) + local_fa8 * *(float *)(uVar13 + 0x90);
    fVar35 = fStack_f84 * *(float *)(uVar13 + 0x34) +
             fStack_f94 * *(float *)(uVar13 + 100) + fStack_fa4 * *(float *)(uVar13 + 0x94);
    fVar36 = fStack_f80 * *(float *)(uVar13 + 0x38) +
             fStack_f90 * *(float *)(uVar13 + 0x68) + fStack_fa0 * *(float *)(uVar13 + 0x98);
    fVar69 = fStack_f7c * *(float *)(uVar13 + 0x3c) +
             fStack_f8c * *(float *)(uVar13 + 0x6c) + fStack_f9c * *(float *)(uVar13 + 0x9c);
    fVar72 = local_f88 * *(float *)(uVar13 + 0x40) +
             local_f98 * local_fb8 + local_fa8 * *(float *)(uVar13 + 0xa0);
    fVar80 = fStack_f84 * *(float *)(uVar13 + 0x44) +
             fStack_f94 * fStack_fb4 + fStack_fa4 * *(float *)(uVar13 + 0xa4);
    fVar70 = fStack_f80 * *(float *)(uVar13 + 0x48) +
             fStack_f90 * fStack_fb0 + fStack_fa0 * *(float *)(uVar13 + 0xa8);
    fVar71 = fStack_f7c * *(float *)(uVar13 + 0x4c) +
             fStack_f8c * fStack_fac + fStack_f9c * *(float *)(uVar13 + 0xac);
    uVar89 = (uint)DAT_01f7b6c0;
    uVar91 = DAT_01f7b6c0._4_4_;
    uVar93 = DAT_01f7b6c0._8_4_;
    uVar95 = DAT_01f7b6c0._12_4_;
    uVar9 = -(uint)(1e-18 <= (float)((uint)fVar97 & uVar89));
    uVar17 = -(uint)(1e-18 <= (float)((uint)fVar98 & uVar91));
    uVar18 = -(uint)(1e-18 <= (float)((uint)fVar99 & uVar93));
    uVar19 = -(uint)(1e-18 <= (float)((uint)fVar100 & uVar95));
    auVar73._0_8_ = CONCAT44(~uVar17,~uVar9) & 0x219392ef219392ef;
    auVar73._8_4_ = ~uVar18 & 0x219392ef;
    auVar73._12_4_ = ~uVar19 & 0x219392ef;
    auVar58._4_4_ = (uint)fVar98 & uVar17;
    auVar58._0_4_ = (uint)fVar97 & uVar9;
    auVar58._8_4_ = (uint)fVar99 & uVar18;
    auVar58._12_4_ = (uint)fVar100 & uVar19;
    auVar73 = auVar73 | auVar58;
    uVar9 = -(uint)(1e-18 <= (float)((uint)fVar24 & uVar89));
    uVar17 = -(uint)(1e-18 <= (float)((uint)fVar35 & uVar91));
    uVar18 = -(uint)(1e-18 <= (float)((uint)fVar36 & uVar93));
    uVar19 = -(uint)(1e-18 <= (float)((uint)fVar69 & uVar95));
    auVar60._0_4_ = (uint)fVar24 & uVar9;
    auVar60._4_4_ = (uint)fVar35 & uVar17;
    auVar60._8_4_ = (uint)fVar36 & uVar18;
    auVar60._12_4_ = (uint)fVar69 & uVar19;
    auVar82._0_8_ = CONCAT44(~uVar17,~uVar9) & 0x219392ef219392ef;
    auVar82._8_4_ = ~uVar18 & 0x219392ef;
    auVar82._12_4_ = ~uVar19 & 0x219392ef;
    auVar82 = auVar82 | auVar60;
    uVar9 = -(uint)(1e-18 <= (float)((uint)fVar72 & uVar89));
    uVar17 = -(uint)(1e-18 <= (float)((uint)fVar80 & uVar91));
    uVar18 = -(uint)(1e-18 <= (float)((uint)fVar70 & uVar93));
    uVar19 = -(uint)(1e-18 <= (float)((uint)fVar71 & uVar95));
    auVar28._0_8_ = CONCAT44(~uVar17,~uVar9) & 0x219392ef219392ef;
    auVar28._8_4_ = ~uVar18 & 0x219392ef;
    auVar28._12_4_ = ~uVar19 & 0x219392ef;
    auVar26._4_4_ = (uint)fVar80 & uVar17;
    auVar26._0_4_ = (uint)fVar72 & uVar9;
    auVar26._8_4_ = (uint)fVar70 & uVar18;
    auVar26._12_4_ = (uint)fVar71 & uVar19;
    auVar28 = auVar28 | auVar26;
    auVar32 = rcpps(_DAT_01f7b6c0,auVar73);
    fVar70 = auVar32._0_4_;
    fVar71 = auVar32._4_4_;
    fVar97 = auVar32._8_4_;
    fVar98 = auVar32._12_4_;
    fVar70 = (1.0 - auVar73._0_4_ * fVar70) * fVar70 + fVar70;
    fVar71 = (1.0 - auVar73._4_4_ * fVar71) * fVar71 + fVar71;
    fVar97 = (1.0 - auVar73._8_4_ * fVar97) * fVar97 + fVar97;
    fVar98 = (1.0 - auVar73._12_4_ * fVar98) * fVar98 + fVar98;
    auVar32 = rcpps(auVar32,auVar82);
    fVar99 = auVar32._0_4_;
    fVar100 = auVar32._4_4_;
    fVar77 = auVar32._8_4_;
    fVar79 = auVar32._12_4_;
    fVar99 = (1.0 - auVar82._0_4_ * fVar99) * fVar99 + fVar99;
    fVar100 = (1.0 - auVar82._4_4_ * fVar100) * fVar100 + fVar100;
    fVar77 = (1.0 - auVar82._8_4_ * fVar77) * fVar77 + fVar77;
    fVar79 = (1.0 - auVar82._12_4_ * fVar79) * fVar79 + fVar79;
    auVar32 = rcpps(auVar32,auVar28);
    fVar81 = auVar32._0_4_;
    fVar96 = auVar32._4_4_;
    fVar86 = auVar32._8_4_;
    fVar88 = auVar32._12_4_;
    fVar81 = (1.0 - auVar28._0_4_ * fVar81) * fVar81 + fVar81;
    fVar96 = (1.0 - auVar28._4_4_ * fVar96) * fVar96 + fVar96;
    fVar86 = (1.0 - auVar28._8_4_ * fVar86) * fVar86 + fVar86;
    fVar88 = (1.0 - auVar28._12_4_ * fVar88) * fVar88 + fVar88;
    fVar72 = (*(float *)(uVar13 + 0x20) * local_fc8 +
             *(float *)(uVar13 + 0x50) * local_fd8 +
             *(float *)(uVar13 + 0x80) * local_fe8 + *(float *)(uVar13 + 0xb0)) * -fVar70;
    fVar80 = (*(float *)(uVar13 + 0x24) * fStack_fc4 +
             *(float *)(uVar13 + 0x54) * fStack_fd4 +
             *(float *)(uVar13 + 0x84) * fStack_fe4 + *(float *)(uVar13 + 0xb4)) * -fVar71;
    auVar56._0_8_ = CONCAT44(fVar80,fVar72);
    auVar56._8_4_ =
         (*(float *)(uVar13 + 0x28) * fStack_fc0 +
         *(float *)(uVar13 + 0x58) * fStack_fd0 +
         *(float *)(uVar13 + 0x88) * fStack_fe0 + *(float *)(uVar13 + 0xb8)) * -fVar97;
    auVar56._12_4_ =
         (*(float *)(uVar13 + 0x2c) * fStack_fbc +
         *(float *)(uVar13 + 0x5c) * fStack_fcc +
         *(float *)(uVar13 + 0x8c) * fStack_fdc + *(float *)(uVar13 + 0xbc)) * -fVar98;
    fVar24 = (*(float *)(uVar13 + 0x30) * local_fc8 +
             *(float *)(uVar13 + 0x60) * local_fd8 +
             *(float *)(uVar13 + 0x90) * local_fe8 + *(float *)(uVar13 + 0xc0)) * -fVar99;
    fVar35 = (*(float *)(uVar13 + 0x34) * fStack_fc4 +
             *(float *)(uVar13 + 100) * fStack_fd4 +
             *(float *)(uVar13 + 0x94) * fStack_fe4 + *(float *)(uVar13 + 0xc4)) * -fVar100;
    auVar40._0_8_ = CONCAT44(fVar35,fVar24);
    auVar40._8_4_ =
         (*(float *)(uVar13 + 0x38) * fStack_fc0 +
         *(float *)(uVar13 + 0x68) * fStack_fd0 +
         *(float *)(uVar13 + 0x98) * fStack_fe0 + *(float *)(uVar13 + 200)) * -fVar77;
    auVar40._12_4_ =
         (*(float *)(uVar13 + 0x3c) * fStack_fbc +
         *(float *)(uVar13 + 0x6c) * fStack_fcc +
         *(float *)(uVar13 + 0x9c) * fStack_fdc + *(float *)(uVar13 + 0xcc)) * -fVar79;
    fVar36 = (*(float *)(uVar13 + 0x40) * local_fc8 +
             local_fb8 * local_fd8 +
             *(float *)(uVar13 + 0xa0) * local_fe8 + *(float *)(uVar13 + 0xd0)) * -fVar81;
    fVar69 = (*(float *)(uVar13 + 0x44) * fStack_fc4 +
             fStack_fb4 * fStack_fd4 +
             *(float *)(uVar13 + 0xa4) * fStack_fe4 + *(float *)(uVar13 + 0xd4)) * -fVar96;
    auVar45._0_8_ = CONCAT44(fVar69,fVar36);
    auVar45._8_4_ =
         (*(float *)(uVar13 + 0x48) * fStack_fc0 +
         fStack_fb0 * fStack_fd0 +
         *(float *)(uVar13 + 0xa8) * fStack_fe0 + *(float *)(uVar13 + 0xd8)) * -fVar86;
    auVar45._12_4_ =
         (*(float *)(uVar13 + 0x4c) * fStack_fbc +
         fStack_fac * fStack_fcc +
         *(float *)(uVar13 + 0xac) * fStack_fdc + *(float *)(uVar13 + 0xdc)) * -fVar88;
    fVar70 = fVar70 + fVar72;
    fVar71 = fVar71 + fVar80;
    fVar97 = fVar97 + auVar56._8_4_;
    fVar98 = fVar98 + auVar56._12_4_;
    auVar74._0_4_ = fVar99 + fVar24;
    auVar74._4_4_ = fVar100 + fVar35;
    auVar74._8_4_ = fVar77 + auVar40._8_4_;
    auVar74._12_4_ = fVar79 + auVar40._12_4_;
    auVar83._0_4_ = fVar81 + fVar36;
    auVar83._4_4_ = fVar96 + fVar69;
    auVar83._8_4_ = fVar86 + auVar45._8_4_;
    auVar83._12_4_ = fVar88 + auVar45._12_4_;
    auVar29._8_4_ = auVar40._8_4_;
    auVar29._0_8_ = auVar40._0_8_;
    auVar29._12_4_ = auVar40._12_4_;
    auVar32 = minps(auVar29,auVar74);
    auVar51._8_4_ = auVar45._8_4_;
    auVar51._0_8_ = auVar45._0_8_;
    auVar51._12_4_ = auVar45._12_4_;
    auVar26 = minps(auVar51,auVar83);
    auVar32 = maxps(auVar32,auVar26);
    auVar52._8_4_ = auVar56._8_4_;
    auVar52._0_8_ = auVar56._0_8_;
    auVar52._12_4_ = auVar56._12_4_;
    auVar39._4_4_ = fVar71;
    auVar39._0_4_ = fVar70;
    auVar39._8_4_ = fVar97;
    auVar39._12_4_ = fVar98;
    auVar58 = minps(auVar52,auVar39);
    auVar44._4_4_ = fVar71;
    auVar44._0_4_ = fVar70;
    auVar44._8_4_ = fVar97;
    auVar44._12_4_ = fVar98;
    auVar44 = maxps(auVar56,auVar44);
    auVar26 = maxps(auVar40,auVar74);
    auVar39 = maxps(auVar45,auVar83);
    auVar26 = minps(auVar26,auVar39);
    auVar39 = maxps(local_1078,auVar58);
    auVar39 = maxps(auVar39,auVar32);
    auVar30._4_4_ = iVar21;
    auVar30._0_4_ = iVar20;
    auVar30._8_4_ = iVar22;
    auVar30._12_4_ = iVar23;
    auVar32 = minps(auVar30,auVar44);
    auVar32 = minps(auVar32,auVar26);
    local_1088._0_4_ = auVar39._0_4_ * 0.99999964;
    local_1088._4_4_ = auVar39._4_4_ * 0.99999964;
    fStack_1080 = auVar39._8_4_ * 0.99999964;
    fStack_107c = auVar39._12_4_ * 0.99999964;
    auVar46._4_4_ = -(uint)((float)local_1088._4_4_ <= auVar32._4_4_ * 1.0000004);
    auVar46._0_4_ = -(uint)((float)local_1088._0_4_ <= auVar32._0_4_ * 1.0000004);
    auVar46._8_4_ = -(uint)(fStack_1080 <= auVar32._8_4_ * 1.0000004);
    auVar46._12_4_ = -(uint)(fStack_107c <= auVar32._12_4_ * 1.0000004);
    uVar9 = movmskps((int)k,auVar46);
    auVar32 = local_1078;
    fVar24 = local_fc8;
    fVar70 = fStack_fc4;
    fVar71 = fStack_fc0;
    fVar97 = fStack_fbc;
    fVar69 = local_ff8;
    fVar98 = fStack_ff4;
    fVar99 = fStack_ff0;
    fVar100 = fStack_fec;
    fVar36 = local_fe8;
    fVar77 = fStack_fe4;
    fVar79 = fStack_fe0;
    fVar81 = fStack_fdc;
    fVar96 = local_1028;
    fVar86 = fStack_1024;
    fVar88 = fStack_1020;
    fVar101 = fStack_101c;
    fVar35 = local_fd8;
    fVar90 = fStack_fd4;
    fVar92 = fStack_fd0;
    fVar94 = fStack_fcc;
    fVar61 = local_1058;
    fVar62 = fStack_1054;
    fVar63 = fStack_1050;
    fVar64 = fStack_104c;
    fVar65 = local_1068;
    fVar66 = fStack_1064;
    fVar67 = fStack_1060;
    fVar68 = fStack_105c;
    fVar72 = local_1008;
    fVar75 = fStack_1004;
    fVar76 = fStack_1000;
    fVar78 = fStack_ffc;
    fVar80 = local_1018;
    fVar84 = fStack_1014;
    fVar85 = fStack_1010;
    fVar87 = fStack_100c;
  }
  k = CONCAT44((int)(k >> 0x20),uVar9);
  if ((RayQueryContext *)k == (RayQueryContext *)0x0) goto LAB_001fd065;
  uVar13 = (ulong)pSVar12 & 0xfffffffffffffff0;
  lVar6 = 0;
  if ((RayQueryContext *)k != (RayQueryContext *)0x0) {
    for (; (k >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  pSVar12 = *(Scene **)(uVar13 + lVar6 * 8);
  uVar9 = uVar9 - 1 & uVar9;
  k = (size_t)pRVar11;
  if (uVar9 != 0) {
    uVar17 = *(uint *)(local_1088 + lVar6 * 4);
    lVar6 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
      }
    }
    pSVar4 = *(Scene **)(uVar13 + lVar6 * 8);
    uVar18 = *(uint *)(local_1088 + lVar6 * 4);
    uVar9 = uVar9 - 1 & uVar9;
    if (uVar9 == 0) {
      k = (size_t)&pRVar11->args;
      if (uVar17 < uVar18) {
        pRVar11->scene = pSVar4;
        *(uint *)&pRVar11->user = uVar18;
        pRVar11 = (RayQueryContext *)k;
      }
      else {
        pRVar11->scene = pSVar12;
        *(uint *)&pRVar11->user = uVar17;
        pRVar11 = (RayQueryContext *)k;
        pSVar12 = pSVar4;
      }
    }
    else {
      auVar31._8_4_ = uVar17;
      auVar31._0_8_ = pSVar12;
      auVar31._12_4_ = 0;
      auVar41._8_4_ = uVar18;
      auVar41._0_8_ = pSVar4;
      auVar41._12_4_ = 0;
      lVar6 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar5 = *(ulong *)(uVar13 + lVar6 * 8);
      iVar2 = *(int *)(local_1088 + lVar6 * 4);
      auVar47._8_4_ = iVar2;
      auVar47._0_8_ = uVar5;
      auVar47._12_4_ = 0;
      auVar53._8_4_ = -(uint)((int)uVar17 < (int)uVar18);
      uVar9 = uVar9 - 1 & uVar9;
      if (uVar9 == 0) {
        auVar53._4_4_ = auVar53._8_4_;
        auVar53._0_4_ = auVar53._8_4_;
        auVar53._12_4_ = auVar53._8_4_;
        auVar32 = auVar31 & auVar53 | ~auVar53 & auVar41;
        auVar39 = auVar41 & auVar53 | ~auVar53 & auVar31;
        auVar54._8_4_ = -(uint)(auVar32._8_4_ < iVar2);
        auVar54._0_8_ = CONCAT44(auVar54._8_4_,auVar54._8_4_);
        auVar54._12_4_ = auVar54._8_4_;
        auVar44 = auVar47 & auVar54 | ~auVar54 & auVar32;
        auVar33._8_4_ = -(uint)(auVar39._8_4_ < auVar44._8_4_);
        auVar33._4_4_ = auVar33._8_4_;
        auVar33._0_4_ = auVar33._8_4_;
        auVar33._12_4_ = auVar33._8_4_;
        auVar26 = ~auVar33 & auVar39 | auVar44 & auVar33;
        pRVar11->scene = (Scene *)auVar26._0_8_;
        pRVar11->user = (RTCRayQueryContext *)auVar26._8_8_;
        *(undefined1 (*) [16])&pRVar11->args = auVar39 & auVar33 | ~auVar33 & auVar44;
        k = (size_t)&pRVar11[1].user;
        pRVar11 = (RayQueryContext *)&pRVar11[1].user;
        pSVar12 = (Scene *)(~auVar54._0_8_ & uVar5 | auVar32._0_8_ & auVar54._0_8_);
        auVar32 = local_1078;
      }
      else {
        lVar6 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        iVar3 = *(int *)(local_1088 + lVar6 * 4);
        auVar57._8_4_ = iVar3;
        auVar57._0_8_ = *(undefined8 *)(uVar13 + lVar6 * 8);
        auVar57._12_4_ = 0;
        auVar55._4_4_ = auVar53._8_4_;
        auVar55._0_4_ = auVar53._8_4_;
        auVar55._8_4_ = auVar53._8_4_;
        auVar55._12_4_ = auVar53._8_4_;
        auVar32 = auVar31 & auVar55 | ~auVar55 & auVar41;
        auVar26 = auVar41 & auVar55 | ~auVar55 & auVar31;
        auVar59._0_4_ = -(uint)(iVar2 < iVar3);
        auVar59._4_4_ = -(uint)(iVar2 < iVar3);
        auVar59._8_4_ = -(uint)(iVar2 < iVar3);
        auVar59._12_4_ = -(uint)(iVar2 < iVar3);
        auVar44 = auVar47 & auVar59 | ~auVar59 & auVar57;
        auVar39 = ~auVar59 & auVar47 | auVar57 & auVar59;
        auVar48._8_4_ = -(uint)(auVar26._8_4_ < auVar39._8_4_);
        auVar48._4_4_ = auVar48._8_4_;
        auVar48._0_4_ = auVar48._8_4_;
        auVar48._12_4_ = auVar48._8_4_;
        auVar58 = auVar26 & auVar48 | ~auVar48 & auVar39;
        auVar39 = ~auVar48 & auVar26 | auVar39 & auVar48;
        auVar42._8_4_ = -(uint)(auVar32._8_4_ < auVar44._8_4_);
        auVar42._0_8_ = CONCAT44(auVar42._8_4_,auVar42._8_4_);
        auVar42._12_4_ = auVar42._8_4_;
        auVar26 = ~auVar42 & auVar32 | auVar44 & auVar42;
        auVar34._8_4_ = -(uint)(auVar26._8_4_ < auVar58._8_4_);
        auVar34._4_4_ = auVar34._8_4_;
        auVar34._0_4_ = auVar34._8_4_;
        auVar34._12_4_ = auVar34._8_4_;
        auVar60 = auVar26 & auVar34 | ~auVar34 & auVar58;
        pRVar11->scene = (Scene *)auVar39._0_8_;
        pRVar11->user = (RTCRayQueryContext *)auVar39._8_8_;
        *(undefined1 (*) [16])&pRVar11->args = ~auVar34 & auVar26 | auVar58 & auVar34;
        pRVar11[1].user = (RTCRayQueryContext *)auVar60._0_8_;
        pRVar11[1].args = (RTCIntersectArguments *)auVar60._8_8_;
        k = (size_t)(pRVar11 + 2);
        pRVar11 = pRVar11 + 2;
        pSVar12 = (Scene *)(auVar32._0_8_ & auVar42._0_8_ | ~auVar42._0_8_ & auVar44._0_8_);
        auVar32 = local_1078;
        fVar61 = local_1058;
        fVar62 = fStack_1054;
        fVar63 = fStack_1050;
        fVar64 = fStack_104c;
        fVar65 = local_1068;
        fVar66 = fStack_1064;
        fVar67 = fStack_1060;
        fVar68 = fStack_105c;
      }
    }
  }
  goto LAB_001fc9fa;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }